

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::doSplitPages(QPDFJob *this,QPDF *pdf)

{
  element_type *peVar1;
  pointer pQVar2;
  element_type *peVar3;
  QPDFDocumentHelper *pQVar4;
  undefined1 *i;
  QPDF *qpdf;
  char cVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar10;
  long *plVar11;
  runtime_error *this_00;
  ulong uVar12;
  QPDFAcroFormDocumentHelper *from_afdh;
  size_type *psVar13;
  void *__buf;
  long lVar14;
  ulong uVar15;
  char cVar16;
  QPDFWriter *pQVar17;
  QPDFAcroFormDocumentHelper *pQVar18;
  QPDFAcroFormDocumentHelper *pQVar19;
  char *pcVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  string __str;
  string outfile;
  QPDFWriter w;
  QPDF outpdf;
  QPDFPageLabelDocumentHelper pldh;
  QPDFAcroFormDocumentHelper afdh;
  string after;
  string before;
  QPDFObjectHandle new_page;
  undefined1 local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  QPDFJob *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  QPDFPageDocumentHelper local_170;
  QPDFAcroFormDocumentHelper *local_150;
  QPDFObjectHandle local_148;
  QPDFAcroFormDocumentHelper local_138;
  QPDFObjectHandle local_118 [2];
  QPDF *local_f8;
  ulong local_f0;
  QPDFAcroFormDocumentHelper *local_e8;
  QPDFAcroFormDocumentHelper *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Head_base<0UL,_QPDF::Members_*,_false> local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_d8 = &local_c8;
  local_d0 = (char *)0x0;
  local_c8 = 0;
  pcVar20 = (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8 = this;
  local_f8 = pdf;
  sVar8 = strlen(pcVar20);
  pcVar9 = strstr(pcVar20,"%d");
  if (pcVar9 == (char *)0x0) {
    if (3 < sVar8) {
      iVar7 = QUtil::str_compare_nocase(pcVar20 + (sVar8 - 4),".pdf");
      peVar1 = (local_1a8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (iVar7 == 0) {
        lVar14 = (long)(peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
        local_138.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)&local_138.m;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,lVar14,lVar14 + sVar8 + -4);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var21) {
          local_170.m.
          super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var21->_vptr__Sp_counted_base;
          local_170.m.
          super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[3];
          local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)&local_170.m;
        }
        else {
          local_170.m.
          super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var21->_vptr__Sp_counted_base;
          local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)*plVar11;
        }
        local_170.super_QPDFDocumentHelper.qpdf = (QPDF *)plVar11[1];
        *plVar11 = (long)p_Var21;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_b8,(string *)(local_178 + 8));
        if ((shared_ptr<QPDFPageDocumentHelper::Members> *)
            local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_170.m) {
          operator_delete(local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                          (ulong)((long)local_170.m.
                                        super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 1));
        }
        if ((shared_ptr<QPDFAcroFormDocumentHelper::Members> *)
            local_138.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_138.m) {
          operator_delete(local_138.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                          (ulong)&(local_138.m.
                                   super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->field_0x1);
        }
        pcVar9 = (char *)((long)(((local_1a8->m).
                                  super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->outfilename).
                                super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + sVar8
                         + -4);
        goto LAB_0017acab;
      }
      pcVar20 = (peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,pcVar20,(allocator<char> *)local_1f8);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var21) {
      local_170.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)p_Var21->_vptr__Sp_counted_base;
      local_170.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[3];
      local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)&local_170.m;
    }
    else {
      local_170.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)p_Var21->_vptr__Sp_counted_base;
      local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)*plVar11;
    }
    local_170.super_QPDFDocumentHelper.qpdf = (QPDF *)plVar11[1];
    *plVar11 = (long)p_Var21;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)(local_178 + 8));
    if ((shared_ptr<QPDFPageDocumentHelper::Members> *)
        local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_170.m) {
      operator_delete(local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                      (ulong)((long)local_170.m.
                                    super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1));
    }
    if ((shared_ptr<QPDFAcroFormDocumentHelper::Members> *)
        local_138.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_138.m) {
      operator_delete(local_138.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                      (ulong)&(local_138.m.
                               super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->field_0x1);
    }
  }
  else {
    lVar14 = (long)pcVar9 - (long)pcVar20;
    if (lVar14 < 0) {
      QIntC::IntConverter<long,_unsigned_long,_true,_false>::error(lVar14);
    }
    local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper = (_func_int **)&local_170.m;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_178 + 8),pcVar20,pcVar20 + lVar14);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)(local_178 + 8));
    if ((shared_ptr<QPDFPageDocumentHelper::Members> *)
        local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper != &local_170.m) {
      operator_delete(local_170.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper,
                      (ulong)((long)local_170.m.
                                    super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1));
    }
    pcVar9 = pcVar9 + 2;
LAB_0017acab:
    pcVar20 = local_d0;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,pcVar20,(ulong)pcVar9);
  }
  bVar6 = shouldRemoveUnreferencedResources(local_1a8,local_f8);
  qpdf = local_f8;
  if (bVar6) {
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)(local_178 + 8),local_f8);
    QPDFPageDocumentHelper::removeUnreferencedResources((QPDFPageDocumentHelper *)(local_178 + 8));
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)(local_178 + 8));
  }
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)(local_178 + 8),qpdf);
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&local_138,qpdf);
  pvVar10 = QPDF::getAllPages(qpdf);
  uVar15 = (long)(pvVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  cVar16 = '\x01';
  if (9 < uVar15) {
    uVar12 = uVar15;
    cVar5 = '\x04';
    do {
      cVar16 = cVar5;
      if (uVar12 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_0017aea6;
      }
      if (uVar12 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_0017aea6;
      }
      if (uVar12 < 10000) goto LAB_0017aea6;
      bVar6 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar5 = cVar16 + '\x04';
    } while (bVar6);
    cVar16 = cVar16 + '\x01';
  }
LAB_0017aea6:
  local_1f8._0_8_ = (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10);
  std::__cxx11::string::_M_construct((ulong)local_1f8,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1f8._0_8_,local_1f8._8_4_,uVar15);
  local_f0 = CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
  if ((QPDFAcroFormDocumentHelper *)local_1f8._0_8_ !=
      (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_e8 = (QPDFAcroFormDocumentHelper *)
             ((long)(pvVar10->
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(pvVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                   )._M_impl.super__Vector_impl_data._M_start);
  if (local_e8 != (QPDFAcroFormDocumentHelper *)0x0) {
    local_e8 = (QPDFAcroFormDocumentHelper *)((long)local_e8 >> 4);
    pQVar18 = (QPDFAcroFormDocumentHelper *)0x0;
    do {
      peVar1 = (local_1a8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar7 = peVar1->split_pages;
      if (iVar7 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar7);
        iVar7 = peVar1->split_pages;
      }
      from_afdh = (QPDFAcroFormDocumentHelper *)
                  ((long)&(pQVar18->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper + (long)iVar7
                  );
      if (local_e8 <= from_afdh) {
        from_afdh = local_e8;
      }
      local_150 = from_afdh;
      QPDF::QPDF((QPDF *)local_178);
      local_e0 = pQVar18;
      QPDF::emptyPDF((QPDF *)local_178);
      bVar6 = QPDFAcroFormDocumentHelper::hasAcroForm(&local_138);
      if (bVar6) {
        local_1f8._0_8_ = (QPDFAcroFormDocumentHelper *)0x0;
        from_afdh = (QPDFAcroFormDocumentHelper *)local_178;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8),
                   (QPDFAcroFormDocumentHelper **)local_1f8,
                   (allocator<QPDFAcroFormDocumentHelper> *)&local_1d8,(QPDF *)local_178);
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
        pQVar18 = (QPDFAcroFormDocumentHelper *)local_1f8._0_8_;
      }
      else {
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pQVar18 = (QPDFAcroFormDocumentHelper *)0x0;
      }
      if (((local_1a8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          suppress_warnings == true) {
        QPDF::setSuppressWarnings((QPDF *)local_178,true);
      }
      iVar7 = (int)from_afdh;
      local_1a0 = p_Var21;
      if (local_e0 < local_150) {
        uVar15 = (long)local_e0 << 4 | 8;
        pQVar19 = local_e0;
        do {
          pQVar2 = (pvVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((QPDFAcroFormDocumentHelper *)
              ((long)(pvVar10->
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pQVar2 >> 4) <= pQVar19) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pQVar19);
          }
          peVar3 = *(element_type **)((long)pQVar2 + (uVar15 - 8));
          p_Var21 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(pQVar2->super_BaseHandle).obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + uVar15);
          if (p_Var21 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_148.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_148.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var21;
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                UNLOCK();
                goto LAB_0017b07a;
              }
            }
            else {
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            }
            p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
          }
LAB_0017b07a:
          local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar3;
          QPDF::addPage((QPDF *)local_178,&local_148,false);
          if (local_148.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            }
          }
          local_78 = peVar3;
          local_70 = p_Var21;
          added_page((QPDF *)&local_68,(QPDFObjectHandle *)local_178);
          if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
          }
          if (pQVar18 != (QPDFAcroFormDocumentHelper *)0x0) {
            local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_68._M_head_impl;
            local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = local_60;
            if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_60->_M_use_count = local_60->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_60->_M_use_count = local_60->_M_use_count + 1;
              }
            }
            if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              }
            }
            from_afdh = &local_138;
            local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar3;
            local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var21;
            QPDFAcroFormDocumentHelper::fixCopiedAnnotations
                      (pQVar18,&local_88,&local_98,from_afdh,
                       (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)0x0);
            if (local_98.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_98.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_88.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
          }
          if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
          }
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
          }
          iVar7 = (int)from_afdh;
          pQVar4 = &pQVar19->super_QPDFDocumentHelper;
          uVar15 = uVar15 + 0x10;
          pQVar19 = (QPDFAcroFormDocumentHelper *)
                    ((long)&(pQVar19->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper + 1);
        } while ((QPDFAcroFormDocumentHelper *)((long)&pQVar4->_vptr_QPDFDocumentHelper + 2) <=
                 local_150);
      }
      p_Var21 = local_1a0;
      bVar6 = QPDFPageLabelDocumentHelper::hasPageLabels
                        ((QPDFPageLabelDocumentHelper *)(local_178 + 8));
      pQVar18 = local_e0;
      uVar15 = local_f0;
      if (bVar6) {
        local_1d8._M_dataplus._M_p = (pointer)0x0;
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_allocated_capacity = 0;
        if ((long)local_e0 < 0) {
          QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error((unsigned_long)local_e0)
          ;
        }
        i = (undefined1 *)
            ((long)&local_150[-1].m.
                    super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 7);
        if ((long)i < 0) {
          QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error((unsigned_long)i);
        }
        iVar7 = 0;
        QPDFPageLabelDocumentHelper::getLabelsForPageRange
                  ((QPDFPageLabelDocumentHelper *)(local_178 + 8),(longlong)pQVar18,(longlong)i,0,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_1d8);
        QPDFObjectHandle::newDictionary();
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/Nums","");
        uVar15 = local_f0;
        QPDFObjectHandle::newArray
                  (local_118,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_1d8);
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_198,(string *)local_1f8,local_118);
        if (local_118[0].super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118[0].super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((QPDFAcroFormDocumentHelper *)local_1f8._0_8_ !=
            (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10)) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        QPDF::getRoot((QPDF *)local_118);
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/PageLabels","");
        QPDFObjectHandle::replaceKey(local_118,(string *)local_1f8,(QPDFObjectHandle *)local_198);
        if ((QPDFAcroFormDocumentHelper *)local_1f8._0_8_ !=
            (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10)) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        if (local_118[0].super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118[0].super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_1d8);
      }
      if (uVar15 >> 0x1f != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar15);
      }
      QUtil::uint_to_string_abi_cxx11_
                ((string *)local_1f8,
                 (QUtil *)((long)&(pQVar18->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper + 1),
                 uVar15 & 0xffffffff,iVar7);
      uVar12 = local_f0;
      if (1 < ((local_1a8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->split_pages) {
        if (uVar15 >> 0x1f != 0) {
          QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(local_f0);
        }
        QUtil::uint_to_string_abi_cxx11_
                  ((string *)local_198,(QUtil *)local_150,uVar12 & 0xffffffff,iVar7);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_198,0,(char *)0x0,0x264e02);
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1d8.field_2._M_allocated_capacity = *psVar13;
          local_1d8.field_2._8_8_ = plVar11[3];
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        }
        else {
          local_1d8.field_2._M_allocated_capacity = *psVar13;
          local_1d8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_1d8._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::_M_append(local_1f8,(ulong)local_1d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_198._0_8_ != (element_type *)local_188) {
          operator_delete((void *)local_198._0_8_,local_188._0_8_ + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     &local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)local_198,(ulong)local_d8);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_1d8.field_2._M_allocated_capacity = *psVar13;
        local_1d8.field_2._8_8_ = plVar11[3];
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *psVar13;
        local_1d8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_1d8._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((element_type *)local_198._0_8_ != (element_type *)local_188) {
        operator_delete((void *)local_198._0_8_,local_188._0_8_ + 1);
      }
      bVar6 = QUtil::same_file((((local_1a8->m).
                                 super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->infilename).
                               super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               local_1d8._M_dataplus._M_p);
      if (bVar6) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,"split pages would overwrite input file with ",&local_1d8);
        std::runtime_error::runtime_error(this_00,(string *)local_198);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      QPDFWriter::QPDFWriter((QPDFWriter *)local_198,(QPDF *)local_178,local_1d8._M_dataplus._M_p);
      pQVar17 = (QPDFWriter *)local_198;
      setWriterOptions(local_1a8,(QPDFWriter *)local_198);
      QPDFWriter::write((QPDFWriter *)local_198,(int)pQVar17,__buf,(size_t)psVar13);
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = &local_1d8;
      local_40 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:3074:21)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:3074:21)>
                 ::_M_manager;
      doIfVerbose(local_1a8,
                  (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((QPDFAcroFormDocumentHelper *)local_1f8._0_8_ !=
          (QPDFAcroFormDocumentHelper *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
      }
      QPDF::~QPDF((QPDF *)local_178);
      peVar1 = (local_1a8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar7 = peVar1->split_pages;
      if (iVar7 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar7);
        iVar7 = peVar1->split_pages;
      }
      pQVar18 = (QPDFAcroFormDocumentHelper *)
                ((long)&(pQVar18->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper + (long)iVar7);
    } while (pQVar18 < local_e8);
  }
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_138);
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)(local_178 + 8));
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDFJob::doSplitPages(QPDF& pdf)
{
    // Generate output file pattern
    std::string before;
    std::string after;
    size_t len = strlen(m->outfilename.get());
    char* num_spot = strstr(const_cast<char*>(m->outfilename.get()), "%d");
    if (num_spot != nullptr) {
        QTC::TC("qpdf", "QPDFJob split-pages %d");
        before = std::string(m->outfilename.get(), QIntC::to_size(num_spot - m->outfilename.get()));
        after = num_spot + 2;
    } else if (
        (len >= 4) && (QUtil::str_compare_nocase(m->outfilename.get() + len - 4, ".pdf") == 0)) {
        QTC::TC("qpdf", "QPDFJob split-pages .pdf");
        before = std::string(m->outfilename.get(), len - 4) + "-";
        after = m->outfilename.get() + len - 4;
    } else {
        QTC::TC("qpdf", "QPDFJob split-pages other");
        before = std::string(m->outfilename.get()) + "-";
    }

    if (shouldRemoveUnreferencedResources(pdf)) {
        QPDFPageDocumentHelper dh(pdf);
        dh.removeUnreferencedResources();
    }
    QPDFPageLabelDocumentHelper pldh(pdf);
    QPDFAcroFormDocumentHelper afdh(pdf);
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    size_t pageno_len = std::to_string(pages.size()).length();
    size_t num_pages = pages.size();
    for (size_t i = 0; i < num_pages; i += QIntC::to_size(m->split_pages)) {
        size_t first = i + 1;
        size_t last = i + QIntC::to_size(m->split_pages);
        if (last > num_pages) {
            last = num_pages;
        }
        QPDF outpdf;
        outpdf.emptyPDF();
        std::shared_ptr<QPDFAcroFormDocumentHelper> out_afdh;
        if (afdh.hasAcroForm()) {
            out_afdh = std::make_shared<QPDFAcroFormDocumentHelper>(outpdf);
        }
        if (m->suppress_warnings) {
            outpdf.setSuppressWarnings(true);
        }
        for (size_t pageno = first; pageno <= last; ++pageno) {
            QPDFObjectHandle page = pages.at(pageno - 1);
            outpdf.addPage(page, false);
            auto new_page = added_page(outpdf, page);
            if (out_afdh.get()) {
                QTC::TC("qpdf", "QPDFJob copy form fields in split_pages");
                try {
                    out_afdh->fixCopiedAnnotations(new_page, page, afdh);
                } catch (std::exception& e) {
                    pdf.warn(
                        qpdf_e_damaged_pdf,
                        "",
                        0,
                        ("Exception caught while fixing copied annotations. This may be a qpdf "
                         "bug." +
                         std::string("Exception: ") + e.what()));
                }
            }
        }
        if (pldh.hasPageLabels()) {
            std::vector<QPDFObjectHandle> labels;
            pldh.getLabelsForPageRange(
                QIntC::to_longlong(first - 1), QIntC::to_longlong(last - 1), 0, labels);
            QPDFObjectHandle page_labels = QPDFObjectHandle::newDictionary();
            page_labels.replaceKey("/Nums", QPDFObjectHandle::newArray(labels));
            outpdf.getRoot().replaceKey("/PageLabels", page_labels);
        }
        std::string page_range = QUtil::uint_to_string(first, QIntC::to_int(pageno_len));
        if (m->split_pages > 1) {
            page_range += "-" + QUtil::uint_to_string(last, QIntC::to_int(pageno_len));
        }
        std::string outfile = before + page_range + after;
        if (QUtil::same_file(m->infilename.get(), outfile.c_str())) {
            throw std::runtime_error("split pages would overwrite input file with " + outfile);
        }
        QPDFWriter w(outpdf, outfile.c_str());
        setWriterOptions(w);
        w.write();
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": wrote file " << outfile << "\n";
        });
    }
}